

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_error_code_e
ktxTexture2_inflateZLIBInt
          (ktxTexture2 *This,ktx_uint8_t *pDeflatedData,ktx_uint8_t *pInflatedData,
          ktx_size_t inflatedDataCapacity)

{
  ktxTexture2_private *pkVar1;
  ktx_uint32_t kVar2;
  ktx_error_code_e kVar3;
  void *__ptr;
  ulong uVar4;
  uint uVar5;
  ktxLevelIndexEntry *__dest;
  ulong uVar6;
  long lVar7;
  ktx_size_t kVar8;
  undefined1 auVar9 [16];
  size_t levelByteLength;
  ulong local_50;
  ulong local_48;
  ktx_uint8_t *local_40;
  ktx_uint8_t *local_38;
  
  kVar3 = KTX_INVALID_VALUE;
  if ((pInflatedData != (ktx_uint8_t *)0x0 && pDeflatedData != (ktx_uint8_t *)0x0) &&
     (kVar3 = KTX_INVALID_OPERATION, This->supercompressionScheme == KTX_SS_END_RANGE)) {
    pkVar1 = This->_private;
    uVar6 = (ulong)(This->numLevels * 0x18);
    local_40 = pDeflatedData;
    local_38 = pInflatedData;
    __ptr = malloc(uVar6);
    if (__ptr == (void *)0x0) {
      kVar3 = KTX_OUT_OF_MEMORY;
    }
    else {
      __dest = pkVar1->_levelIndex;
      local_48 = uVar6;
      kVar2 = ktxTexture2_calcPostInflationLevelAlignment(This);
      uVar6 = (ulong)This->numLevels;
      if ((int)(This->numLevels - 1) < 0) {
        kVar8 = 0;
      }
      else {
        kVar8 = 0;
        lVar7 = 0;
        do {
          uVar5 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar5;
          local_50 = inflatedDataCapacity;
          kVar3 = ktxUncompressZLIBInt
                            (local_38 + lVar7,&local_50,local_40 + __dest[uVar6].byteOffset,
                             pkVar1->_levelIndex[uVar6].byteLength);
          if (kVar3 != KTX_SUCCESS) {
LAB_001eb31b:
            free(__ptr);
            return kVar3;
          }
          uVar4 = This->_private->_levelIndex[uVar6].uncompressedByteLength;
          if (uVar4 != local_50) {
            kVar3 = KTX_DECOMPRESS_LENGTH_ERROR;
            goto LAB_001eb31b;
          }
          *(long *)((long)__ptr + uVar6 * 0x18) = lVar7;
          *(ulong *)((long)__ptr + uVar6 * 0x18 + 8) = uVar4;
          *(ulong *)((long)__ptr + uVar6 * 0x18 + 0x10) = uVar4;
          auVar9 = ZEXT416((uint)((float)uVar4 / (float)kVar2));
          auVar9 = roundss(auVar9,auVar9,10);
          uVar4 = (long)(auVar9._0_4_ * (float)kVar2) & 0xffffffff;
          kVar8 = kVar8 + uVar4;
          lVar7 = lVar7 + uVar4;
          inflatedDataCapacity = inflatedDataCapacity - uVar4;
        } while (0 < (int)uVar5);
      }
      This->dataSize = kVar8;
      This->supercompressionScheme = KTX_SS_BEGIN_RANGE;
      memcpy(__dest,__ptr,local_48);
      free(__ptr);
      This->_private->_requiredLevelAlignment = kVar2;
      kVar3 = KTX_SUCCESS;
    }
  }
  return kVar3;
}

Assistant:

KTX_error_code
ktxTexture2_inflateZLIBInt(ktxTexture2* This, ktx_uint8_t* pDeflatedData,
                           ktx_uint8_t* pInflatedData,
                           ktx_size_t inflatedDataCapacity)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    uint64_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint32_t uncompressedLevelAlignment;

    if (pDeflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (pInflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (This->supercompressionScheme != KTX_SS_ZLIB)
        return KTX_INVALID_OPERATION;

    nindex = malloc(levelIndexByteLength);
    if (nindex == NULL)
        return KTX_OUT_OF_MEMORY;

    uncompressedLevelAlignment =
        ktxTexture2_calcPostInflationLevelAlignment(This);

    ktx_size_t inflatedByteLength = 0;
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLength = inflatedDataCapacity;
        KTX_error_code result = ktxUncompressZLIBInt(pInflatedData + levelOffset,
                                                    &levelByteLength,
                                                    &pDeflatedData[cindex[level].byteOffset],
                                                    cindex[level].byteLength);
        if (result != KTX_SUCCESS) {
            free(nindex);
            return result;
        }

        if (This->_private->_levelIndex[level].uncompressedByteLength != levelByteLength) {
            free(nindex);
            return KTX_DECOMPRESS_LENGTH_ERROR;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                            levelByteLength;
        ktx_size_t paddedLevelByteLength
              = _KTX_PADN(uncompressedLevelAlignment, levelByteLength);
        inflatedByteLength += paddedLevelByteLength;
        levelOffset += paddedLevelByteLength;
        inflatedDataCapacity -= paddedLevelByteLength;
    }

    // Now modify the texture.

    This->dataSize = inflatedByteLength;
    This->supercompressionScheme = KTX_SS_NONE;
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(nindex);
    This->_private->_requiredLevelAlignment = uncompressedLevelAlignment;

    return KTX_SUCCESS;
}